

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::ReportOnProcessDetach<Memory::Recycler::ReportLeaksOnProcessDetach()::__0>
          (Recycler *this,anon_class_8_1_8991fb9c fn)

{
  BOOL BVar1;
  PageAllocator *pPVar2;
  Recycler *this_local;
  anon_class_8_1_8991fb9c fn_local;
  
  this_local = fn.this;
  pPVar2 = MarkContext::GetPageAllocator(&this->markContext);
  (**pPVar2->_vptr_PageAllocatorBase)();
  BVar1 = IsConcurrentState(this);
  if (BVar1 != 0) {
    AbortConcurrent(this,true);
  }
  BVar1 = CollectionInProgress(this);
  if (BVar1 == 0) {
    SetExternalRootMarker(this,(ExternalRootMarker)0x0,(void *)0x0);
    ResetThreadId(this);
    ReportLeaksOnProcessDetach::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)&this_local);
  }
  else {
    Output::Print(L"WARNING: Thread terminated during GC.  Can\'t dump object graph\n");
  }
  return;
}

Assistant:

void
Recycler::ReportOnProcessDetach(Fn fn)
{
#if DBG
    // Process detach can be done on any thread, just disable the thread check
    this->markContext.GetPageAllocator()->SetDisableThreadAccessCheck();
#endif

#if ENABLE_CONCURRENT_GC
    if (this->IsConcurrentState())
    {
        this->AbortConcurrent(true);
    }

    if (this->CollectionInProgress())
    {
        Output::Print(_u("WARNING: Thread terminated during GC.  Can't dump object graph\n"));
        return;
    }
#else
    Assert(!this->CollectionInProgress());
#endif
    // Don't mark external roots on another thread
    this->SetExternalRootMarker(NULL, NULL);
#if DBG
    this->ResetThreadId();
#endif
    fn();
}